

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::CloseRulesFileStream(cmGlobalNinjaGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  string local_30;
  
  pcVar1 = (this->RulesFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (this->RulesFileStream)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)0x0;
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Rules file stream was not open.","");
  cmSystemTools::Error(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CloseRulesFileStream()
{
  if (this->RulesFileStream) {
    this->RulesFileStream.reset();
  } else {
    cmSystemTools::Error("Rules file stream was not open.");
  }
}